

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall nuraft::asio_rpc_client::set_busy_flag(asio_rpc_client *this,bool to)

{
  element_type *peVar1;
  int iVar2;
  undefined7 in_register_00000031;
  bool bVar3;
  string local_38;
  
  if ((int)CONCAT71(in_register_00000031,to) == 0) {
    LOCK();
    bVar3 = (this->socket_busy_)._M_base._M_i == true;
    if (bVar3) {
      (this->socket_busy_)._M_base._M_i = false;
    }
    UNLOCK();
    if (bVar3) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      return;
    }
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (iVar2 < 1) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_38,"socket %p is already idle, race happened on connection to %s:%s",this,
               (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
    (**(code **)(*(long *)peVar1 + 0x40))
              (peVar1,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
               ,"set_busy_flag",0x4fb,&local_38);
  }
  else {
    LOCK();
    bVar3 = (this->socket_busy_)._M_base._M_i == false;
    if (bVar3) {
      (this->socket_busy_)._M_base._M_i = true;
    }
    UNLOCK();
    if (bVar3) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 == (element_type *)0x0) {
      return;
    }
    iVar2 = (**(code **)(*(long *)peVar1 + 0x38))();
    if (iVar2 < 1) {
      return;
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_
              (&local_38,"socket %p is already in use, race happened on connection to %s:%s",this,
               (this->host_)._M_dataplus._M_p,(this->port_)._M_dataplus._M_p);
    (**(code **)(*(long *)peVar1 + 0x40))
              (peVar1,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
               ,"set_busy_flag",0x4f4,&local_38);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

void set_busy_flag(bool to) {
        if (to == true) {
            bool exp = false;
            if (!socket_busy_.compare_exchange_strong(exp, true)) {
                p_ft("socket %p is already in use, race happened on connection to %s:%s",
                     this, host_.c_str(), port_.c_str());
                assert(0);
            }
        } else {
            bool exp = true;
            if (!socket_busy_.compare_exchange_strong(exp, false)) {
                p_ft("socket %p is already idle, race happened on connection to %s:%s",
                     this, host_.c_str(), port_.c_str());
                assert(0);
            }
        }
    }